

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ptr<snapshot> __thiscall nuraft::raft_server::get_last_snapshot(raft_server *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot> pVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x5d8))->__data);
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x5c8));
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x5d8));
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<snapshot>)pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> raft_server::get_last_snapshot() const {
    std::lock_guard<std::mutex> l(last_snapshot_lock_);
    ptr<snapshot> ret = last_snapshot_;
    return ret;
}